

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall ieee754::round_up(ieee754 *this)

{
  byte bVar1;
  uchar *puVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  
  uVar4 = mantissa_msb_index(this);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar4) {
    uVar6 = (ulong)uVar4;
  }
  while( true ) {
    if (uVar6 == uVar5) {
      bVar3 = mantissa_msb_mask(this);
      bVar1 = this->buf[(int)uVar4];
      bVar7 = bVar1 + 1 & bVar3;
      this->buf[(int)uVar4] = ~bVar3 & bVar1;
      this->buf[(int)uVar4] = this->buf[(int)uVar4] | bVar7;
      return (uint)(bVar7 == 0);
    }
    puVar2 = this->buf;
    if (puVar2[uVar5] != 0xff) break;
    puVar2[uVar5] = '\0';
    uVar5 = uVar5 + 1;
  }
  puVar2[uVar5] = puVar2[uVar5] + '\x01';
  return 0;
}

Assistant:

int round_up()
    {
        /* add to the low byte, and carry as needed to whole bytes */
        int imsb = mantissa_msb_index();
        for (int i = 0 ; i < imsb ; ++i)
        {
            if (buf[i] == 0xff)
            {
                /* this overflows the byte - zero it and carry to the next */
                buf[i] = 0;
            }
            else
            {
                /* no overflow - increment this byte and return "no carry" */
                buf[i] += 1;
                return FALSE;
            }
        }
        
        /* 
         *   if we got this far, we've carried into the most significant
         *   byte, which is a partial byte - we need to use the msb bit mask
         *   for this arithmetic 
         */
        unsigned char mask = mantissa_msb_mask();
        int b = (buf[imsb] + 1) & mask;
        buf[imsb] &= ~mask;
        buf[imsb] |= b;

        /* if we wrapped that to zero, we carried into the implied lead bit */
        return (b == 0);
    }